

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.h
# Opt level: O0

DictionaryTypeHandlerBase<unsigned_short> *
Js::DictionaryTypeHandlerBase<unsigned_short>::
NewTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
          (Recycler *recycler,int initialCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots)

{
  Recycler *pRVar1;
  DictionaryTypeHandlerBase<unsigned_short> *this;
  TrackAllocData local_40;
  uint16 local_18;
  uint16 local_16;
  int local_14;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int initialCapacity_local;
  Recycler *recycler_local;
  
  local_18 = offsetOfInlineSlots;
  local_16 = inlineSlotCapacity;
  local_14 = initialCapacity;
  _offsetOfInlineSlots_local = recycler;
  PropertyIndexRangesBase<Js::PropertyIndexRanges<unsigned_short>_>::VerifySlotCapacity
            (initialCapacity);
  pRVar1 = _offsetOfInlineSlots_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryTypeHandler.h"
             ,0x3a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  this = (DictionaryTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  DictionaryTypeHandlerBase(this,_offsetOfInlineSlots_local,local_14,local_16,local_18);
  return this;
}

Assistant:

static SubClassType* NewTypeHandler(Recycler * recycler, int initialCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots)
        {
            PropertyIndexRangesType::VerifySlotCapacity(initialCapacity);
            return RecyclerNew(recycler, SubClassType, recycler, initialCapacity, inlineSlotCapacity, offsetOfInlineSlots);
        }